

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient3dslow(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int elen;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double b;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double b_00;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double b_01;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double _2;
  double _1;
  double _0;
  double _n;
  double _m;
  double _l;
  double _k;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double a1lo;
  double a1hi;
  double a0lo;
  double a0hi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int deterlen;
  double deter [192];
  int ablen;
  double abdet [128];
  int clen;
  int blen;
  int alen;
  double cdet [64];
  double bdet [64];
  double adet [64];
  int temp32tlen;
  int temp32len;
  int temp16len;
  double temp32t [32];
  double temp32 [32];
  double temp16 [16];
  double cxay [8];
  double cxby [8];
  double bxay [8];
  double axcy [8];
  double bxcy [8];
  double axby [8];
  double cxay7;
  double cxby7;
  double bxay7;
  double axcy7;
  double bxcy7;
  double axby7;
  double negatetail;
  double negate;
  double cdztail;
  double cdytail;
  double cdxtail;
  double bdztail;
  double bdytail;
  double bdxtail;
  double adztail;
  double adytail;
  double adxtail;
  double cdz;
  double cdy;
  double cdx;
  double bdz;
  double bdy;
  double bdx;
  double adz;
  double ady;
  double adx;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar13 = *pa - *pd;
  dVar14 = (*pa - (dVar13 + (*pa - dVar13))) + ((*pa - dVar13) - *pd);
  dVar15 = pa[1] - pd[1];
  dVar16 = (pa[1] - (dVar15 + (pa[1] - dVar15))) + ((pa[1] - dVar15) - pd[1]);
  b = pa[2] - pd[2];
  dVar1 = pa[2];
  dVar2 = pd[2];
  dVar3 = pa[2];
  dVar17 = *pb - *pd;
  dVar18 = (*pb - (dVar17 + (*pb - dVar17))) + ((*pb - dVar17) - *pd);
  dVar19 = pb[1] - pd[1];
  dVar20 = (pb[1] - (dVar19 + (pb[1] - dVar19))) + ((pb[1] - dVar19) - pd[1]);
  b_00 = pb[2] - pd[2];
  dVar4 = pb[2];
  dVar5 = pd[2];
  dVar6 = pb[2];
  dVar21 = *pc - *pd;
  dVar22 = (*pc - (dVar21 + (*pc - dVar21))) + ((*pc - dVar21) - *pd);
  dVar23 = pc[1] - pd[1];
  dVar24 = (pc[1] - (dVar23 + (pc[1] - dVar23))) + ((pc[1] - dVar23) - pd[1]);
  b_01 = pc[2] - pd[2];
  dVar7 = pc[2];
  dVar8 = pd[2];
  dVar9 = pc[2];
  dVar25 = splitter * dVar14 - (splitter * dVar14 - dVar14);
  dVar26 = splitter * dVar20 - (splitter * dVar20 - dVar20);
  bxcy[7] = (dVar14 - dVar25) * (dVar20 - dVar26) +
            -(-dVar25 * (dVar20 - dVar26) +
             -(dVar14 - dVar25) * dVar26 + -dVar25 * dVar26 + dVar14 * dVar20);
  dVar25 = -dVar15;
  dVar26 = -dVar16;
  dVar27 = splitter * dVar18 - (splitter * dVar18 - dVar18);
  dVar28 = dVar18 - dVar27;
  dVar29 = splitter * dVar26 - (splitter * dVar26 - dVar26);
  dVar30 = dVar26 - dVar29;
  dVar31 = dVar18 * dVar26;
  cxby[7] = dVar28 * dVar30 + -(-dVar27 * dVar30 + -dVar28 * dVar29 + -dVar27 * dVar29 + dVar31);
  dVar32 = splitter * dVar17 - (splitter * dVar17 - dVar17);
  dVar33 = dVar17 - dVar32;
  dVar26 = dVar17 * dVar26;
  dVar29 = dVar33 * dVar30 + -(-dVar32 * dVar30 + -dVar33 * dVar29 + -dVar32 * dVar29 + dVar26);
  dVar34 = dVar31 + dVar29;
  dVar29 = (dVar31 - (dVar34 - (dVar34 - dVar31))) + (dVar29 - (dVar34 - dVar31));
  dVar30 = dVar26 + dVar34;
  dVar34 = dVar34 - (dVar30 - dVar26);
  dVar26 = splitter * dVar25 - (splitter * dVar25 - dVar25);
  dVar31 = dVar25 - dVar26;
  dVar35 = dVar18 * dVar25;
  dVar27 = dVar28 * dVar31 + -(-dVar27 * dVar31 + -dVar28 * dVar26 + -dVar27 * dVar26 + dVar35);
  dVar28 = dVar29 + dVar27;
  bxay[0] = (dVar29 - (dVar28 - (dVar28 - dVar29))) + (dVar27 - (dVar28 - dVar29));
  dVar27 = dVar34 + dVar28;
  dVar28 = (dVar34 - (dVar27 - (dVar27 - dVar34))) + (dVar28 - (dVar27 - dVar34));
  dVar29 = dVar30 + dVar27;
  dVar27 = (dVar30 - (dVar29 - (dVar29 - dVar30))) + (dVar27 - (dVar29 - dVar30));
  dVar25 = dVar17 * dVar25;
  dVar26 = dVar33 * dVar31 + -(-dVar32 * dVar31 + -dVar33 * dVar26 + -dVar32 * dVar26 + dVar25);
  dVar30 = dVar35 + dVar26;
  dVar26 = (dVar35 - (dVar30 - (dVar30 - dVar35))) + (dVar26 - (dVar30 - dVar35));
  dVar31 = dVar28 + dVar26;
  bxay[1] = (dVar28 - (dVar31 - (dVar31 - dVar28))) + (dVar26 - (dVar31 - dVar28));
  dVar26 = dVar27 + dVar31;
  dVar27 = (dVar27 - (dVar26 - (dVar26 - dVar27))) + (dVar31 - (dVar26 - dVar27));
  dVar28 = dVar29 + dVar26;
  dVar26 = (dVar29 - (dVar28 - (dVar28 - dVar29))) + (dVar26 - (dVar28 - dVar29));
  dVar29 = dVar25 + dVar30;
  dVar25 = (dVar25 - (dVar29 - (dVar29 - dVar25))) + (dVar30 - (dVar29 - dVar25));
  dVar30 = dVar27 + dVar25;
  bxay[2] = (dVar27 - (dVar30 - (dVar30 - dVar27))) + (dVar25 - (dVar30 - dVar27));
  dVar25 = dVar26 + dVar30;
  dVar26 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar30 - (dVar25 - dVar26));
  dVar27 = dVar28 + dVar25;
  dVar25 = (dVar28 - (dVar27 - (dVar27 - dVar28))) + (dVar25 - (dVar27 - dVar28));
  dVar28 = dVar26 + dVar29;
  bxay[3] = (dVar26 - (dVar28 - (dVar28 - dVar26))) + (dVar29 - (dVar28 - dVar26));
  dVar26 = dVar25 + dVar28;
  bxay[4] = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar28 - (dVar26 - dVar25));
  bxay[6] = dVar27 + dVar26;
  bxay[5] = (dVar27 - (bxay[6] - (bxay[6] - dVar27))) + (dVar26 - (bxay[6] - dVar27));
  dVar25 = splitter * dVar18 - (splitter * dVar18 - dVar18);
  dVar26 = dVar18 - dVar25;
  dVar27 = splitter * dVar24 - (splitter * dVar24 - dVar24);
  dVar28 = dVar24 - dVar27;
  dVar29 = dVar18 * dVar24;
  axcy[7] = dVar26 * dVar28 + -(-dVar25 * dVar28 + -dVar26 * dVar27 + -dVar25 * dVar27 + dVar29);
  dVar30 = splitter * dVar17 - (splitter * dVar17 - dVar17);
  dVar31 = dVar17 - dVar30;
  dVar32 = dVar17 * dVar24;
  dVar27 = dVar31 * dVar28 + -(-dVar30 * dVar28 + -dVar31 * dVar27 + -dVar30 * dVar27 + dVar32);
  dVar33 = dVar29 + dVar27;
  dVar27 = (dVar29 - (dVar33 - (dVar33 - dVar29))) + (dVar27 - (dVar33 - dVar29));
  dVar28 = dVar32 + dVar33;
  dVar33 = dVar33 - (dVar28 - dVar32);
  dVar29 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar32 = dVar23 - dVar29;
  dVar18 = dVar18 * dVar23;
  dVar25 = dVar26 * dVar32 + -(-dVar25 * dVar32 + -dVar26 * dVar29 + -dVar25 * dVar29 + dVar18);
  dVar26 = dVar27 + dVar25;
  bxcy[0] = (dVar27 - (dVar26 - (dVar26 - dVar27))) + (dVar25 - (dVar26 - dVar27));
  dVar25 = dVar33 + dVar26;
  dVar26 = (dVar33 - (dVar25 - (dVar25 - dVar33))) + (dVar26 - (dVar25 - dVar33));
  dVar27 = dVar28 + dVar25;
  dVar25 = (dVar28 - (dVar27 - (dVar27 - dVar28))) + (dVar25 - (dVar27 - dVar28));
  dVar17 = dVar17 * dVar23;
  dVar28 = dVar31 * dVar32 + -(-dVar30 * dVar32 + -dVar31 * dVar29 + -dVar30 * dVar29 + dVar17);
  dVar29 = dVar18 + dVar28;
  dVar28 = (dVar18 - (dVar29 - (dVar29 - dVar18))) + (dVar28 - (dVar29 - dVar18));
  dVar30 = dVar26 + dVar28;
  bxcy[1] = (dVar26 - (dVar30 - (dVar30 - dVar26))) + (dVar28 - (dVar30 - dVar26));
  dVar26 = dVar25 + dVar30;
  dVar25 = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar30 - (dVar26 - dVar25));
  dVar28 = dVar27 + dVar26;
  dVar26 = (dVar27 - (dVar28 - (dVar28 - dVar27))) + (dVar26 - (dVar28 - dVar27));
  dVar27 = dVar17 + dVar29;
  dVar29 = (dVar17 - (dVar27 - (dVar27 - dVar17))) + (dVar29 - (dVar27 - dVar17));
  dVar30 = dVar25 + dVar29;
  bxcy[2] = (dVar25 - (dVar30 - (dVar30 - dVar25))) + (dVar29 - (dVar30 - dVar25));
  dVar25 = dVar26 + dVar30;
  dVar26 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar30 - (dVar25 - dVar26));
  dVar29 = dVar28 + dVar25;
  dVar25 = (dVar28 - (dVar29 - (dVar29 - dVar28))) + (dVar25 - (dVar29 - dVar28));
  dVar28 = dVar26 + dVar27;
  bxcy[3] = (dVar26 - (dVar28 - (dVar28 - dVar26))) + (dVar27 - (dVar28 - dVar26));
  dVar26 = dVar25 + dVar28;
  bxcy[4] = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar28 - (dVar26 - dVar25));
  bxcy[6] = dVar29 + dVar26;
  bxcy[5] = (dVar29 - (bxcy[6] - (bxcy[6] - dVar29))) + (dVar26 - (bxcy[6] - dVar29));
  dVar19 = -dVar19;
  dVar20 = -dVar20;
  dVar25 = splitter * dVar22 - (splitter * dVar22 - dVar22);
  dVar26 = dVar22 - dVar25;
  dVar27 = splitter * dVar20 - (splitter * dVar20 - dVar20);
  dVar28 = dVar20 - dVar27;
  dVar29 = dVar22 * dVar20;
  cxay[7] = dVar26 * dVar28 + -(-dVar25 * dVar28 + -dVar26 * dVar27 + -dVar25 * dVar27 + dVar29);
  dVar30 = splitter * dVar21 - (splitter * dVar21 - dVar21);
  dVar31 = dVar21 - dVar30;
  dVar20 = dVar21 * dVar20;
  dVar27 = dVar31 * dVar28 + -(-dVar30 * dVar28 + -dVar31 * dVar27 + -dVar30 * dVar27 + dVar20);
  dVar32 = dVar29 + dVar27;
  dVar27 = (dVar29 - (dVar32 - (dVar32 - dVar29))) + (dVar27 - (dVar32 - dVar29));
  dVar28 = dVar20 + dVar32;
  dVar32 = dVar32 - (dVar28 - dVar20);
  dVar20 = splitter * dVar19 - (splitter * dVar19 - dVar19);
  dVar29 = dVar19 - dVar20;
  dVar33 = dVar22 * dVar19;
  dVar25 = dVar26 * dVar29 + -(-dVar25 * dVar29 + -dVar26 * dVar20 + -dVar25 * dVar20 + dVar33);
  dVar26 = dVar27 + dVar25;
  cxby[0] = (dVar27 - (dVar26 - (dVar26 - dVar27))) + (dVar25 - (dVar26 - dVar27));
  dVar25 = dVar32 + dVar26;
  dVar26 = (dVar32 - (dVar25 - (dVar25 - dVar32))) + (dVar26 - (dVar25 - dVar32));
  dVar27 = dVar28 + dVar25;
  dVar25 = (dVar28 - (dVar27 - (dVar27 - dVar28))) + (dVar25 - (dVar27 - dVar28));
  dVar19 = dVar21 * dVar19;
  dVar20 = dVar31 * dVar29 + -(-dVar30 * dVar29 + -dVar31 * dVar20 + -dVar30 * dVar20 + dVar19);
  dVar28 = dVar33 + dVar20;
  dVar20 = (dVar33 - (dVar28 - (dVar28 - dVar33))) + (dVar20 - (dVar28 - dVar33));
  dVar29 = dVar26 + dVar20;
  cxby[1] = (dVar26 - (dVar29 - (dVar29 - dVar26))) + (dVar20 - (dVar29 - dVar26));
  dVar26 = dVar25 + dVar29;
  dVar25 = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar29 - (dVar26 - dVar25));
  dVar20 = dVar27 + dVar26;
  dVar26 = (dVar27 - (dVar20 - (dVar20 - dVar27))) + (dVar26 - (dVar20 - dVar27));
  dVar27 = dVar19 + dVar28;
  dVar19 = (dVar19 - (dVar27 - (dVar27 - dVar19))) + (dVar28 - (dVar27 - dVar19));
  dVar28 = dVar25 + dVar19;
  cxby[2] = (dVar25 - (dVar28 - (dVar28 - dVar25))) + (dVar19 - (dVar28 - dVar25));
  dVar25 = dVar26 + dVar28;
  dVar26 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar28 - (dVar25 - dVar26));
  dVar19 = dVar20 + dVar25;
  dVar25 = (dVar20 - (dVar19 - (dVar19 - dVar20))) + (dVar25 - (dVar19 - dVar20));
  dVar20 = dVar26 + dVar27;
  cxby[3] = (dVar26 - (dVar20 - (dVar20 - dVar26))) + (dVar27 - (dVar20 - dVar26));
  dVar26 = dVar25 + dVar20;
  cxby[4] = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar20 - (dVar26 - dVar25));
  cxby[6] = dVar19 + dVar26;
  cxby[5] = (dVar19 - (cxby[6] - (cxby[6] - dVar19))) + (dVar26 - (cxby[6] - dVar19));
  dVar25 = splitter * dVar22 - (splitter * dVar22 - dVar22);
  dVar26 = dVar22 - dVar25;
  dVar19 = splitter * dVar16 - (splitter * dVar16 - dVar16);
  dVar20 = dVar16 - dVar19;
  dVar27 = dVar22 * dVar16;
  temp16[0xf] = dVar26 * dVar20 + -(-dVar25 * dVar20 + -dVar26 * dVar19 + -dVar25 * dVar19 + dVar27)
  ;
  dVar28 = splitter * dVar21 - (splitter * dVar21 - dVar21);
  dVar29 = dVar21 - dVar28;
  dVar16 = dVar21 * dVar16;
  dVar19 = dVar29 * dVar20 + -(-dVar28 * dVar20 + -dVar29 * dVar19 + -dVar28 * dVar19 + dVar16);
  dVar30 = dVar27 + dVar19;
  dVar19 = (dVar27 - (dVar30 - (dVar30 - dVar27))) + (dVar19 - (dVar30 - dVar27));
  dVar20 = dVar16 + dVar30;
  dVar30 = dVar30 - (dVar20 - dVar16);
  dVar27 = splitter * dVar15 - (splitter * dVar15 - dVar15);
  dVar31 = dVar15 - dVar27;
  dVar22 = dVar22 * dVar15;
  dVar25 = dVar26 * dVar31 + -(-dVar25 * dVar31 + -dVar26 * dVar27 + -dVar25 * dVar27 + dVar22);
  dVar26 = dVar19 + dVar25;
  cxay[0] = (dVar19 - (dVar26 - (dVar26 - dVar19))) + (dVar25 - (dVar26 - dVar19));
  dVar25 = dVar30 + dVar26;
  dVar26 = (dVar30 - (dVar25 - (dVar25 - dVar30))) + (dVar26 - (dVar25 - dVar30));
  dVar19 = dVar20 + dVar25;
  dVar25 = (dVar20 - (dVar19 - (dVar19 - dVar20))) + (dVar25 - (dVar19 - dVar20));
  dVar21 = dVar21 * dVar15;
  dVar20 = dVar29 * dVar31 + -(-dVar28 * dVar31 + -dVar29 * dVar27 + -dVar28 * dVar27 + dVar21);
  dVar15 = dVar22 + dVar20;
  dVar20 = (dVar22 - (dVar15 - (dVar15 - dVar22))) + (dVar20 - (dVar15 - dVar22));
  dVar27 = dVar26 + dVar20;
  cxay[1] = (dVar26 - (dVar27 - (dVar27 - dVar26))) + (dVar20 - (dVar27 - dVar26));
  dVar26 = dVar25 + dVar27;
  dVar25 = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar27 - (dVar26 - dVar25));
  dVar20 = dVar19 + dVar26;
  dVar26 = (dVar19 - (dVar20 - (dVar20 - dVar19))) + (dVar26 - (dVar20 - dVar19));
  dVar19 = dVar21 + dVar15;
  dVar15 = (dVar21 - (dVar19 - (dVar19 - dVar21))) + (dVar15 - (dVar19 - dVar21));
  dVar27 = dVar25 + dVar15;
  cxay[2] = (dVar25 - (dVar27 - (dVar27 - dVar25))) + (dVar15 - (dVar27 - dVar25));
  dVar25 = dVar26 + dVar27;
  dVar26 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar27 - (dVar25 - dVar26));
  dVar15 = dVar20 + dVar25;
  dVar25 = (dVar20 - (dVar15 - (dVar15 - dVar20))) + (dVar25 - (dVar15 - dVar20));
  dVar20 = dVar26 + dVar19;
  cxay[3] = (dVar26 - (dVar20 - (dVar20 - dVar26))) + (dVar19 - (dVar20 - dVar26));
  dVar26 = dVar25 + dVar20;
  cxay[4] = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar20 - (dVar26 - dVar25));
  cxay[6] = dVar15 + dVar26;
  cxay[5] = (dVar15 - (cxay[6] - (cxay[6] - dVar15))) + (dVar26 - (cxay[6] - dVar15));
  dVar23 = -dVar23;
  dVar24 = -dVar24;
  dVar25 = splitter * dVar14 - (splitter * dVar14 - dVar14);
  dVar26 = dVar14 - dVar25;
  dVar19 = splitter * dVar24 - (splitter * dVar24 - dVar24);
  dVar20 = dVar24 - dVar19;
  dVar15 = dVar14 * dVar24;
  bxay[7] = dVar26 * dVar20 + -(-dVar25 * dVar20 + -dVar26 * dVar19 + -dVar25 * dVar19 + dVar15);
  dVar27 = splitter * dVar13 - (splitter * dVar13 - dVar13);
  dVar28 = dVar13 - dVar27;
  dVar24 = dVar13 * dVar24;
  dVar19 = dVar28 * dVar20 + -(-dVar27 * dVar20 + -dVar28 * dVar19 + -dVar27 * dVar19 + dVar24);
  dVar29 = dVar15 + dVar19;
  dVar19 = (dVar15 - (dVar29 - (dVar29 - dVar15))) + (dVar19 - (dVar29 - dVar15));
  dVar20 = dVar24 + dVar29;
  dVar29 = dVar29 - (dVar20 - dVar24);
  dVar24 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar15 = dVar23 - dVar24;
  dVar14 = dVar14 * dVar23;
  dVar25 = dVar26 * dVar15 + -(-dVar25 * dVar15 + -dVar26 * dVar24 + -dVar25 * dVar24 + dVar14);
  dVar26 = dVar19 + dVar25;
  axcy[0] = (dVar19 - (dVar26 - (dVar26 - dVar19))) + (dVar25 - (dVar26 - dVar19));
  dVar25 = dVar29 + dVar26;
  dVar26 = (dVar29 - (dVar25 - (dVar25 - dVar29))) + (dVar26 - (dVar25 - dVar29));
  dVar19 = dVar20 + dVar25;
  dVar25 = (dVar20 - (dVar19 - (dVar19 - dVar20))) + (dVar25 - (dVar19 - dVar20));
  dVar13 = dVar13 * dVar23;
  dVar20 = dVar28 * dVar15 + -(-dVar27 * dVar15 + -dVar28 * dVar24 + -dVar27 * dVar24 + dVar13);
  dVar23 = dVar14 + dVar20;
  dVar20 = (dVar14 - (dVar23 - (dVar23 - dVar14))) + (dVar20 - (dVar23 - dVar14));
  dVar24 = dVar26 + dVar20;
  axcy[1] = (dVar26 - (dVar24 - (dVar24 - dVar26))) + (dVar20 - (dVar24 - dVar26));
  dVar26 = dVar25 + dVar24;
  dVar25 = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar24 - (dVar26 - dVar25));
  dVar20 = dVar19 + dVar26;
  dVar26 = (dVar19 - (dVar20 - (dVar20 - dVar19))) + (dVar26 - (dVar20 - dVar19));
  dVar19 = dVar13 + dVar23;
  dVar23 = (dVar13 - (dVar19 - (dVar19 - dVar13))) + (dVar23 - (dVar19 - dVar13));
  dVar24 = dVar25 + dVar23;
  axcy[2] = (dVar25 - (dVar24 - (dVar24 - dVar25))) + (dVar23 - (dVar24 - dVar25));
  dVar25 = dVar26 + dVar24;
  dVar26 = (dVar26 - (dVar25 - (dVar25 - dVar26))) + (dVar24 - (dVar25 - dVar26));
  dVar23 = dVar20 + dVar25;
  dVar25 = (dVar20 - (dVar23 - (dVar23 - dVar20))) + (dVar25 - (dVar23 - dVar20));
  dVar20 = dVar26 + dVar19;
  axcy[3] = (dVar26 - (dVar20 - (dVar20 - dVar26))) + (dVar19 - (dVar20 - dVar26));
  dVar26 = dVar25 + dVar20;
  axcy[4] = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar20 - (dVar26 - dVar25));
  axcy[6] = dVar23 + dVar26;
  axcy[5] = (dVar23 - (axcy[6] - (axcy[6] - dVar23))) + (dVar26 - (axcy[6] - dVar23));
  iVar10 = fast_expansion_sum_zeroelim(8,axcy + 7,8,cxay + 7,temp32 + 0x1f);
  iVar11 = scale_expansion_zeroelim(iVar10,temp32 + 0x1f,b,temp32t + 0x1f);
  iVar10 = scale_expansion_zeroelim
                     (iVar10,temp32 + 0x1f,(dVar3 - (b + (dVar1 - b))) + ((dVar1 - b) - dVar2),
                      (double *)&temp32len);
  iVar10 = fast_expansion_sum_zeroelim
                     (iVar11,temp32t + 0x1f,iVar10,(double *)&temp32len,bdet + 0x3f);
  iVar11 = fast_expansion_sum_zeroelim(8,temp16 + 0xf,8,bxay + 7,temp32 + 0x1f);
  iVar12 = scale_expansion_zeroelim(iVar11,temp32 + 0x1f,b_00,temp32t + 0x1f);
  iVar11 = scale_expansion_zeroelim
                     (iVar11,temp32 + 0x1f,
                      (dVar6 - (b_00 + (dVar4 - b_00))) + ((dVar4 - b_00) - dVar5),
                      (double *)&temp32len);
  iVar11 = fast_expansion_sum_zeroelim
                     (iVar12,temp32t + 0x1f,iVar11,(double *)&temp32len,cdet + 0x3f);
  iVar12 = fast_expansion_sum_zeroelim(8,bxcy + 7,8,cxby + 7,temp32 + 0x1f);
  elen = scale_expansion_zeroelim(iVar12,temp32 + 0x1f,b_01,temp32t + 0x1f);
  iVar12 = scale_expansion_zeroelim
                     (iVar12,temp32 + 0x1f,
                      (dVar9 - (b_01 + (dVar7 - b_01))) + ((dVar7 - b_01) - dVar8),
                      (double *)&temp32len);
  abdet[0x7f]._4_4_ =
       fast_expansion_sum_zeroelim(elen,temp32t + 0x1f,iVar12,(double *)&temp32len,(double *)&blen);
  iVar10 = fast_expansion_sum_zeroelim
                     (iVar10,bdet + 0x3f,iVar11,cdet + 0x3f,(double *)&stack0xfffffffffffff0e8);
  iVar10 = fast_expansion_sum_zeroelim
                     (iVar10,(double *)&stack0xfffffffffffff0e8,abdet[0x7f]._4_4_,(double *)&blen,
                      (double *)&stack0xffffffffffffead8);
  return *(double *)(&stack0xffffffffffffead8 + (long)(iVar10 + -1) * 8);
}

Assistant:

REAL orient3dslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL adx, ady, adz, bdx, bdy, bdz, cdx, cdy, cdz;
  REAL adxtail, adytail, adztail;
  REAL bdxtail, bdytail, bdztail;
  REAL cdxtail, cdytail, cdztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16], temp32[32], temp32t[32];
  int temp16len, temp32len, temp32tlen;
  REAL adet[64], bdet[64], cdet[64];
  int alen, blen, clen;
  REAL abdet[128];
  int ablen;
  REAL deter[192];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pa[2], pd[2], adz, adztail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pb[2], pd[2], bdz, bdztail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);
  Two_Diff(pc[2], pd[2], cdz, cdztail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;

  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, adz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, adztail, temp32t);
  alen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     adet);

  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, bdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, bdztail, temp32t);
  blen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     bdet);

  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, cdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, cdztail, temp32t);
  clen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}